

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::BringWindowToDisplayFront(ImGuiWindow *window)

{
  int iVar1;
  ImGuiWindow **ppIVar2;
  ImGuiContext *pIVar3;
  uint uVar4;
  int iVar5;
  
  pIVar3 = GImGui;
  ppIVar2 = (GImGui->Windows).Data;
  iVar1 = (GImGui->Windows).Size;
  if ((ppIVar2[(long)iVar1 + -1] != window) && (ppIVar2[(long)iVar1 + -1]->RootWindow != window)) {
    iVar5 = 1;
    for (uVar4 = iVar1 - 2; -1 < (int)uVar4; uVar4 = uVar4 - 1) {
      if (ppIVar2[uVar4] == window) {
        memmove(ppIVar2 + uVar4,ppIVar2 + (ulong)uVar4 + 1,(long)iVar5 << 3);
        (pIVar3->Windows).Data[(long)(pIVar3->Windows).Size + -1] = window;
        return;
      }
      iVar5 = iVar5 + 1;
    }
  }
  return;
}

Assistant:

void ImGui::BringWindowToDisplayFront(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* current_front_window = g.Windows.back();
    if (current_front_window == window || current_front_window->RootWindow == window)
        return;
    for (int i = g.Windows.Size - 2; i >= 0; i--) // We can ignore the front most window
        if (g.Windows[i] == window)
        {
            memmove(&g.Windows[i], &g.Windows[i + 1], (size_t)(g.Windows.Size - i - 1) * sizeof(ImGuiWindow*));
            g.Windows[g.Windows.Size - 1] = window;
            break;
        }
}